

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void boost::notify_all_at_thread_exit(condition_variable *cond,unique_lock<boost::mutex> *lk)

{
  thread_data_base *ptVar1;
  mutex *pmVar2;
  unique_lock<boost::mutex> *in_RSI;
  undefined8 in_RDI;
  thread_data_base *current_thread_data;
  
  ptVar1 = detail::get_current_thread_data();
  if (ptVar1 != (thread_data_base *)0x0) {
    pmVar2 = unique_lock<boost::mutex>::release(in_RSI);
    (*ptVar1->_vptr_thread_data_base[3])(ptVar1,in_RDI,pmVar2);
  }
  return;
}

Assistant:

BOOST_THREAD_DECL void notify_all_at_thread_exit(condition_variable& cond, unique_lock<mutex> lk)
    {
      detail::thread_data_base* const current_thread_data(detail::get_current_thread_data());
      if(current_thread_data)
      {
        current_thread_data->notify_all_at_thread_exit(&cond, lk.release());
      }
    }